

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall IntrusiveListTest_pop_back_Test::TestBody(IntrusiveListTest_pop_back_Test *this)

{
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  TestObjectList list;
  undefined8 local_68;
  undefined8 uStack_60;
  TestObjectList local_58;
  TestObjectList local_38;
  
  local_68 = 0x200000001;
  uStack_60 = 0x400000003;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68);
  anon_unknown.dwarf_6462d::IntrusiveListTest::NewList
            (&local_38,(IntrusiveListTest *)&local_58,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back(&local_38);
  local_68 = 0x200000001;
  uStack_60 = CONCAT44(uStack_60._4_4_,3);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68,(long)&uStack_60 + 4);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_38,&local_58,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back(&local_38);
  local_68 = 0x200000001;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68,&uStack_60);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_38,&local_58,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back(&local_38);
  local_68 = CONCAT44(local_68._4_4_,1);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68,(long)&local_68 + 4);
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_38,&local_58,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_back(&local_38);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  anon_unknown.dwarf_6462d::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_38,&local_58,expected_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&local_38);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, pop_back) {
  TestObjectList list = NewList({1, 2, 3, 4});

  list.pop_back();
  AssertListEq(list, {1, 2, 3});
  list.pop_back();
  AssertListEq(list, {1, 2});
  list.pop_back();
  AssertListEq(list, {1});
  list.pop_back();
  AssertListEq(list, {});
}